

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O3

QCborMap __thiscall QCborMap::fromJsonObject(QCborMap *this,QJsonObject *obj)

{
  QCborContainerPrivate *pQVar1;
  totally_ordered_wrapper<QCborContainerPrivate_*> __old_val_1;
  long in_FS_OFFSET;
  QExplicitlySharedDataPointer<QCborContainerPrivate> __old_val;
  QExplicitlySharedDataPointer<QCborContainerPrivate> local_50;
  QExplicitlySharedDataPointer<QCborContainerPrivate> local_48;
  QExplicitlySharedDataPointer<QCborContainerPrivate> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->d).d.ptr = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QCborMap(this);
  pQVar1 = (obj->o).d.ptr;
  local_50.d.ptr = (totally_ordered_wrapper<QCborContainerPrivate_*>)(QCborContainerPrivate *)0x0;
  (obj->o).d.ptr = (QCborContainerPrivate *)0x0;
  local_40.d.ptr = (totally_ordered_wrapper<QCborContainerPrivate_*>)(QCborContainerPrivate *)0x0;
  QExplicitlySharedDataPointer<QCborContainerPrivate>::~QExplicitlySharedDataPointer(&local_40);
  local_48.d.ptr = (totally_ordered_wrapper<QCborContainerPrivate_*>)(QCborContainerPrivate *)0x0;
  local_40.d.ptr = (totally_ordered_wrapper<QCborContainerPrivate_*>)(this->d).d.ptr;
  (this->d).d.ptr = pQVar1;
  QExplicitlySharedDataPointer<QCborContainerPrivate>::~QExplicitlySharedDataPointer(&local_40);
  QExplicitlySharedDataPointer<QCborContainerPrivate>::~QExplicitlySharedDataPointer(&local_48);
  QExplicitlySharedDataPointer<QCborContainerPrivate>::~QExplicitlySharedDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
           (QExplicitlySharedDataPointer<QCborContainerPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QCborMap QCborMap::fromJsonObject(QJsonObject &&obj) noexcept
{
    QCborMap result;
    result.d = std::exchange(obj.o, {});
    return result;
}